

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

page_offset_t __thiscall duckdb::ZSTDCompressionState::GetCurrentOffset(ZSTDCompressionState *this)

{
  BufferHandle *this_00;
  data_ptr_t pdVar1;
  
  this_00 = optional_ptr<duckdb::BufferHandle,_true>::operator*(&this->current_buffer);
  pdVar1 = BufferHandle::Ptr(this_00);
  return *(int *)&this->current_buffer_ptr - (int)pdVar1;
}

Assistant:

page_offset_t GetCurrentOffset() {
		auto &handle = *current_buffer;
		auto start_of_buffer = handle.Ptr();
		D_ASSERT(current_buffer_ptr >= start_of_buffer);
		auto res = (page_offset_t)(current_buffer_ptr - start_of_buffer);
		D_ASSERT(res <= GetWritableSpace(info));
		return res;
	}